

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_flavor_kind(parser *p)

{
  wchar_t wVar1;
  char *name;
  wchar_t tval;
  parser *p_local;
  
  name = parser_getsym(p,"tval");
  wVar1 = tval_find_idx(name);
  if (wVar1 < L'\x01') {
    p_local._4_4_ = PARSE_ERROR_UNRECOGNISED_TVAL;
  }
  else {
    flavor_glyph = parser_getchar(p,"glyph");
    p_local._4_4_ = PARSE_ERROR_NONE;
    flavor_tval = wVar1;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_flavor_kind(struct parser *p) {
	int tval = tval_find_idx(parser_getsym(p, "tval"));

	if (tval <= 0) {
		return PARSE_ERROR_UNRECOGNISED_TVAL;
	}
	flavor_glyph = parser_getchar(p, "glyph");
	flavor_tval = (unsigned int) tval;
	return PARSE_ERROR_NONE;
}